

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O1

bool __thiscall
Assimp::AssbinImporter::CanRead
          (AssbinImporter *this,string *pFile,IOSystem *pIOHandler,bool param_3)

{
  int iVar1;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char s [32];
  undefined8 local_48;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  char local_38;
  char cStack_37;
  char cStack_36;
  long *plVar2;
  
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"rb","",CONCAT71(in_register_00000009,param_3));
  iVar1 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_48);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (local_48 != &local_38) {
    operator_delete(local_48);
  }
  if (plVar2 == (long *)0x0) {
    bVar3 = false;
  }
  else {
    (**(code **)(*plVar2 + 0x10))(plVar2,&local_48,1,0x20);
    (*pIOHandler->_vptr_IOSystem[5])(pIOHandler,plVar2);
    auVar5[0] = -(local_48._3_1_ == 'I');
    auVar5[1] = -(local_48._4_1_ == 'M');
    auVar5[2] = -(local_48._5_1_ == 'P');
    auVar5[3] = -(local_48._6_1_ == '.');
    auVar5[4] = -(local_48._7_1_ == 'b');
    auVar5[5] = -(cStack_40 == 'i');
    auVar5[6] = -(cStack_3f == 'n');
    auVar5[7] = -(cStack_3e == 'a');
    auVar5[8] = -(cStack_3d == 'r');
    auVar5[9] = -(cStack_3c == 'y');
    auVar5[10] = -(cStack_3b == '-');
    auVar5[0xb] = -(cStack_3a == 'd');
    auVar5[0xc] = -(cStack_39 == 'u');
    auVar5[0xd] = -(local_38 == 'm');
    auVar5[0xe] = -(cStack_37 == 'p');
    auVar5[0xf] = -(cStack_36 == '.');
    auVar4[0] = -(local_48._0_1_ == (string)0x41);
    auVar4[1] = -(local_48._1_1_ == 'S');
    auVar4[2] = -(local_48._2_1_ == 'S');
    auVar4[3] = -(local_48._3_1_ == 'I');
    auVar4[4] = -(local_48._4_1_ == 'M');
    auVar4[5] = -(local_48._5_1_ == 'P');
    auVar4[6] = -(local_48._6_1_ == '.');
    auVar4[7] = -(local_48._7_1_ == 'b');
    auVar4[8] = -(cStack_40 == 'i');
    auVar4[9] = -(cStack_3f == 'n');
    auVar4[10] = -(cStack_3e == 'a');
    auVar4[0xb] = -(cStack_3d == 'r');
    auVar4[0xc] = -(cStack_3c == 'y');
    auVar4[0xd] = -(cStack_3b == '-');
    auVar4[0xe] = -(cStack_3a == 'd');
    auVar4[0xf] = -(cStack_39 == 'u');
    auVar4 = auVar4 & auVar5;
    bVar3 = (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff;
  }
  return bVar3;
}

Assistant:

bool AssbinImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool /*checkSig*/ ) const {
    IOStream * in = pIOHandler->Open(pFile);
    if (nullptr == in) {
        return false;
    }

    char s[32];
    in->Read( s, sizeof(char), 32 );

    pIOHandler->Close(in);

    return strncmp( s, "ASSIMP.binary-dump.", 19 ) == 0;
}